

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::setTranslatorOperator
          (CommonCore *this,InterfaceHandle translator,
          shared_ptr<helics::TranslatorOperator> *callbacks)

{
  string_view message;
  string_view message_00;
  bool bVar1;
  int iVar2;
  GlobalFederateId GVar3;
  pair<helics::route_id,_helics::ActionMessage> *this_00;
  basic_string_view<char,_std::char_traits<char>_> *this_01;
  char *__str;
  undefined8 in_RDX;
  undefined4 in_ESI;
  ActionMessage *in_RDI;
  uint16_t index;
  ActionMessage transOpUpdate;
  pair<helics::route_id,_helics::ActionMessage> *hndl;
  CommonCore *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  InterfaceHandle in_stack_fffffffffffffeb4;
  char *in_stack_fffffffffffffeb8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffec0;
  undefined4 uVar4;
  action_t startingAction;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
  *in_stack_fffffffffffffef0;
  CommonCore *in_stack_ffffffffffffff28;
  
  uVar4 = (undefined4)in_RDX;
  startingAction = (action_t)((ulong)in_RDX >> 0x20);
  if (setTranslatorOperator(helics::InterfaceHandle,std::shared_ptr<helics::TranslatorOperator>)::
      nullTranslator == '\0') {
    iVar2 = __cxa_guard_acquire(&setTranslatorOperator(helics::InterfaceHandle,std::shared_ptr<helics::TranslatorOperator>)
                                 ::nullTranslator);
    if (iVar2 != 0) {
      std::make_shared<helics::NullTranslatorOperator>();
      std::shared_ptr<helics::TranslatorOperator>::shared_ptr<helics::NullTranslatorOperator,void>
                ((shared_ptr<helics::TranslatorOperator> *)
                 CONCAT44(in_stack_fffffffffffffeb4.hid,in_stack_fffffffffffffeb0),
                 (shared_ptr<helics::NullTranslatorOperator> *)in_stack_fffffffffffffea8);
      std::shared_ptr<helics::NullTranslatorOperator>::~shared_ptr
                ((shared_ptr<helics::NullTranslatorOperator> *)0x47560a);
      __cxa_atexit(std::shared_ptr<helics::TranslatorOperator>::~shared_ptr,
                   &setTranslatorOperator::nullTranslator,&__dso_handle);
      __cxa_guard_release(&setTranslatorOperator(helics::InterfaceHandle,std::shared_ptr<helics::TranslatorOperator>)
                           ::nullTranslator);
    }
  }
  this_00 = getHandleInfo(in_stack_fffffffffffffea8,in_stack_fffffffffffffeb4);
  if (this_00 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    this_01 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (this_01,in_stack_fffffffffffffeb8);
    message._M_len._4_4_ = startingAction;
    message._M_len._0_4_ = uVar4;
    message._M_str = (char *)in_RDI;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_01,message);
    __cxa_throw(this_01,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  if ((char)(this_00->second).messageID != 't') {
    __str = (char *)__cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffec0,__str);
    message_00._M_len._4_4_ = startingAction;
    message_00._M_len._0_4_ = uVar4;
    message_00._M_str = (char *)in_RDI;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_fffffffffffffec0,message_00);
    __cxa_throw(__str,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  ActionMessage::ActionMessage(in_RDI,startingAction);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)CONCAT44(startingAction,uVar4));
  if (!bVar1) {
    std::shared_ptr<helics::TranslatorOperator>::operator=
              ((shared_ptr<helics::TranslatorOperator> *)
               CONCAT44(in_stack_fffffffffffffeb4.hid,in_stack_fffffffffffffeb0),
               (shared_ptr<helics::TranslatorOperator> *)in_stack_fffffffffffffea8);
  }
  getNextAirlockIndex(in_stack_ffffffffffffff28);
  std::array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL>::
  operator[]((array<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>,_4UL> *
             )CONCAT44(in_stack_fffffffffffffeb4.hid,in_stack_fffffffffffffeb0),
             (size_type)in_stack_fffffffffffffea8);
  gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
  load<std::shared_ptr<helics::TranslatorOperator>>
            ((AirLock<std::any,_std::mutex,_std::condition_variable> *)in_RDI,
             (shared_ptr<helics::TranslatorOperator> *)CONCAT44(startingAction,uVar4));
  GVar3 = BasicHandleInfo::getFederateId((BasicHandleInfo *)this_00);
  gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>
  ::push<helics::ActionMessage&>
            (in_stack_fffffffffffffef0,(ActionMessage *)CONCAT44(in_ESI,GVar3.gid));
  ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(GVar3.gid,in_stack_fffffffffffffeb0));
  return;
}

Assistant:

void CommonCore::setTranslatorOperator(InterfaceHandle translator,
                                       std::shared_ptr<TranslatorOperator> callbacks)
{
    static const std::shared_ptr<TranslatorOperator> nullTranslator =
        std::make_shared<NullTranslatorOperator>();
    const auto* hndl = getHandleInfo(translator);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("translator handle is not valid"));
    }
    if ((hndl->handleType != InterfaceType::TRANSLATOR)) {
        throw(InvalidIdentifier("translator identifier does not point to a valid translator"));
    }
    ActionMessage transOpUpdate(CMD_CORE_CONFIGURE);
    transOpUpdate.messageID = UPDATE_TRANSLATOR_OPERATOR;
    if (!callbacks) {
        callbacks = nullTranslator;
    }
    auto index = getNextAirlockIndex();
    dataAirlocks[index].load(std::move(callbacks));
    transOpUpdate.counter = index;
    transOpUpdate.source_id = hndl->getFederateId();
    transOpUpdate.source_handle = translator;
    actionQueue.push(transOpUpdate);
}